

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_server.h
# Opt level: O0

void __thiscall
rest_rpc::rpc_service::rpc_server::publish<person>
          (rpc_server *this,string *key,string *token,person *data)

{
  string_view msg;
  bool bVar1;
  rpc_server *this_00;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_true>
  ec;
  element_type *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  error_category *s;
  size_type in_RSI;
  char *in_RDI;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_false,_true>,_std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_false,_true>_>
  pVar2;
  error_code eVar3;
  shared_ptr<rest_rpc::rpc_service::connection> conn;
  _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_false,_true>
  it;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_false,_true>,_std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_false,_true>_>
  range;
  unique_lock<std::mutex> lock;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  shared_data;
  unique_lock<std::mutex> lock_1;
  person *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  int in_stack_fffffffffffffe54;
  element_type *in_stack_fffffffffffffe58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_160 [16];
  string *in_stack_fffffffffffffeb0;
  string *in_stack_fffffffffffffeb8;
  connection *in_stack_fffffffffffffec0;
  rpc_server *in_stack_fffffffffffffec8;
  string local_100 [48];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_true>
  local_d0;
  string local_c8 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_true>
  local_a8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_true>
  local_a0 [5];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [68];
  uint local_34;
  
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)
             CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
             (mutex_type *)in_stack_fffffffffffffe48);
  bVar1 = std::
          unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>_>_>
          ::empty((unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>_>_>
                   *)0x2b15b8);
  local_34 = (uint)bVar1;
  std::unique_lock<std::mutex>::~unique_lock
            ((unique_lock<std::mutex> *)
             CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
  if (local_34 == 0) {
    __lhs = local_78;
    person::person((person *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                   in_stack_fffffffffffffe48);
    get_shared_data<person>(in_stack_fffffffffffffec8,(person *)in_stack_fffffffffffffec0);
    person::~person((person *)0x2b1632);
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)
               CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
               (mutex_type *)in_stack_fffffffffffffe48);
    this_00 = (rpc_server *)(in_RDI + 0x230);
    std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         this_00);
    pVar2 = std::
            unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>_>_>
            ::equal_range((unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>_>_>
                           *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                          (key_type *)in_stack_fffffffffffffe48);
    local_a0[0]._M_cur =
         (__node_type *)
         pVar2.second.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_true>
         ._M_cur;
    ec._M_cur = (__node_type *)
                pVar2.first.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_true>
                ._M_cur;
    local_a8._M_cur = ec._M_cur;
    std::__cxx11::string::~string(local_c8);
    bVar1 = std::__detail::operator!=(&local_a8,local_a0);
    if (bVar1) {
      local_d0._M_cur = local_a8._M_cur;
      while (bVar1 = std::__detail::operator!=(&local_d0,local_a0), bVar1) {
        std::__detail::
        _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_false,_true>
        ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_false,_true>
                      *)0x2b171c);
        std::weak_ptr<rest_rpc::rpc_service::connection>::lock
                  ((weak_ptr<rest_rpc::rpc_service::connection> *)in_stack_fffffffffffffe58);
        bVar1 = std::operator==((shared_ptr<rest_rpc::rpc_service::connection> *)
                                CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                                in_stack_fffffffffffffe48);
        if (bVar1) {
LAB_002b1763:
          local_34 = 4;
        }
        else {
          this_01 = std::
                    __shared_ptr_access<rest_rpc::rpc_service::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<rest_rpc::rpc_service::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x2b1752);
          bVar1 = connection::has_closed(this_01);
          if (bVar1) goto LAB_002b1763;
          in_stack_fffffffffffffe58 =
               std::
               __shared_ptr_access<rest_rpc::rpc_service::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<rest_rpc::rpc_service::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2b17fe);
          std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               this_00);
          std::
          __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
          connection::publish(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                              in_stack_fffffffffffffeb0);
          std::__cxx11::string::~string(local_100);
          local_34 = 0;
        }
        std::shared_ptr<rest_rpc::rpc_service::connection>::~shared_ptr
                  ((shared_ptr<rest_rpc::rpc_service::connection> *)0x2b1865);
        std::__detail::
        _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_false,_true>
        ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_false,_true>
                      *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
      }
    }
    else {
      eVar3 = asio::error::make_error_code(0);
      s = eVar3._M_cat;
      in_stack_fffffffffffffe54 = eVar3._M_value;
      std::operator+(in_RDI,in_RCX);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffe58,
                     (char *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
      nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>::
      basic_string_view<std::allocator<char>>
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)s);
      msg.size_ = in_RSI;
      msg.data_ = (const_pointer)__lhs;
      error_callback(this_00,(error_code *)ec._M_cur,msg);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffec0);
      std::__cxx11::string::~string(local_160);
    }
    std::unique_lock<std::mutex>::~unique_lock
              ((unique_lock<std::mutex> *)
               CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
    std::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~shared_ptr((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x2b19d7);
  }
  return;
}

Assistant:

void publish(std::string key, std::string token, T data) {
    {
      std::unique_lock<std::mutex> lock(sub_mtx_);
      if (sub_map_.empty())
        return;
    }

    std::shared_ptr<std::string> shared_data =
        get_shared_data<T>(std::move(data));
    std::unique_lock<std::mutex> lock(sub_mtx_);
    auto range = sub_map_.equal_range(key + token);
    if (range.first != range.second) {
      for (auto it = range.first; it != range.second; ++it) {
        auto conn = it->second.lock();
        if (conn == nullptr || conn->has_closed()) {
          continue;
        }

        conn->publish(key + token, *shared_data);
      }
    } else {
      error_callback(
          asio::error::make_error_code(asio::error::invalid_argument),
          "The subscriber of the key: " + key + " does not exist.");
    }
  }